

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_export.c
# Opt level: O3

REF_STATUS ref_export_i_like_cfd_grid(REF_GRID ref_grid,char *filename)

{
  size_t __size;
  REF_NODE pRVar1;
  REF_GLOB *pRVar2;
  REF_CELL pRVar3;
  bool bVar4;
  REF_GRID ref_grid_00;
  FILE *pFVar5;
  REF_INT *pRVar6;
  REF_INT *pRVar7;
  REF_STATUS RVar8;
  uint uVar9;
  void *pvVar10;
  void *__s;
  long lVar11;
  undefined8 uVar12;
  int iVar13;
  long lVar14;
  ulong uVar15;
  char *pcVar16;
  ulong uVar17;
  uint uVar18;
  REF_INT RVar19;
  int iVar20;
  REF_INT max_id;
  REF_INT min_id;
  REF_INT nodes [27];
  int local_e8;
  uint local_e4;
  REF_GRID local_e0;
  FILE *local_d8;
  void *local_d0;
  void *local_c8;
  REF_INT *local_c0;
  REF_INT *local_b8;
  ulong local_b0;
  int local_a8;
  int iStack_a4;
  uint local_a0;
  int local_9c;
  
  if (ref_grid->twod == 0) {
    pcVar16 = "expected twod convention grid";
    uVar12 = 0xa42;
    goto LAB_0016f8f5;
  }
  pRVar1 = ref_grid->node;
  local_d8 = fopen(filename,"w");
  if (local_d8 == (FILE *)0x0) {
    printf("unable to open %s\n",filename);
    pcVar16 = "unable to open file";
    uVar12 = 0xa46;
    goto LAB_0016fb04;
  }
  iVar13 = pRVar1->max;
  lVar14 = (long)iVar13;
  if (lVar14 < 0) {
    pcVar16 = "malloc o2n of REF_INT negative";
    uVar12 = 0xa48;
    goto LAB_0016f8f5;
  }
  __size = lVar14 * 4;
  pvVar10 = malloc(__size);
  if (pvVar10 == (void *)0x0) {
    pcVar16 = "malloc o2n of REF_INT NULL";
    uVar12 = 0xa48;
    goto LAB_0016fb04;
  }
  local_d0 = pvVar10;
  if (iVar13 == 0) {
    pvVar10 = malloc(__size);
    if (pvVar10 == (void *)0x0) goto LAB_0016fae3;
    uVar18 = 0;
    local_c8 = pvVar10;
  }
  else {
    memset(pvVar10,0xff,__size);
    __s = malloc(__size);
    if (__s == (void *)0x0) {
LAB_0016fae3:
      pcVar16 = "malloc n2o of REF_INT NULL";
      uVar12 = 0xa49;
      goto LAB_0016fb04;
    }
    local_c8 = __s;
    memset(__s,0xff,__size);
    pRVar2 = pRVar1->global;
    lVar11 = 0;
    uVar18 = 0;
    do {
      if (-1 < pRVar2[lVar11]) {
        *(uint *)((long)pvVar10 + lVar11 * 4) = uVar18;
        *(int *)((long)local_c8 + (long)(int)uVar18 * 4) = (int)lVar11;
        uVar18 = uVar18 + 1;
      }
      lVar11 = lVar11 + 1;
    } while (lVar14 != lVar11);
  }
  pFVar5 = local_d8;
  local_e0 = ref_grid;
  fprintf(local_d8,"%d %d %d\n",(ulong)uVar18,(ulong)(uint)ref_grid->cell[3]->n,
          (ulong)(uint)ref_grid->cell[6]->n);
  pvVar10 = local_c8;
  if (0 < (int)uVar18) {
    uVar15 = 0;
    do {
      lVar14 = (long)*(int *)((long)pvVar10 + uVar15 * 4);
      fprintf(pFVar5,"%.16E %.16E\n",pRVar1->real[lVar14 * 0xf],pRVar1->real[lVar14 * 0xf + 1]);
      uVar15 = uVar15 + 1;
    } while (uVar18 != uVar15);
  }
  pRVar3 = local_e0->cell[3];
  iVar13 = 0;
  if (0 < pRVar3->max) {
    RVar19 = 0;
    iVar13 = 0;
    do {
      RVar8 = ref_cell_nodes(pRVar3,RVar19,&local_a8);
      if (RVar8 == 0) {
        iVar13 = iVar13 + 1;
        fprintf(pFVar5,"%d %d %d\n",(ulong)(*(int *)((long)local_d0 + (long)local_a8 * 4) + 1),
                (ulong)(*(int *)((long)local_d0 + (long)iStack_a4 * 4) + 1),
                (ulong)(*(int *)((long)local_d0 + (long)(int)local_a0 * 4) + 1));
      }
      RVar19 = RVar19 + 1;
    } while (RVar19 < pRVar3->max);
  }
  lVar14 = (long)pRVar3->n;
  if (iVar13 == pRVar3->n) {
    pRVar3 = local_e0->cell[6];
    if (0 < pRVar3->max) {
      RVar19 = 0;
      do {
        RVar8 = ref_cell_nodes(pRVar3,RVar19,&local_a8);
        if (RVar8 == 0) {
          fprintf(pFVar5,"%d %d %d %d\n",(ulong)(*(int *)((long)local_d0 + (long)local_a8 * 4) + 1),
                  (ulong)(*(int *)((long)local_d0 + (long)iStack_a4 * 4) + 1),
                  (ulong)(*(int *)((long)local_d0 + (long)(int)local_a0 * 4) + 1),
                  (ulong)(*(int *)((long)local_d0 + (long)local_9c * 4) + 1));
        }
        RVar19 = RVar19 + 1;
      } while (RVar19 < pRVar3->max);
    }
    lVar14 = (long)pRVar3->n;
    if (lVar14 == 0) {
      pRVar3 = local_e0->cell[0];
      uVar18 = ref_cell_id_range(pRVar3,local_e0->mpi,(REF_INT *)&local_e4,&local_e8);
      if (uVar18 != 0) {
        pcVar16 = "id range";
        uVar12 = 0xa6e;
LAB_0016fb9d:
        uVar15 = (ulong)uVar18;
LAB_0016fba0:
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",
               uVar12,"ref_export_i_like_cfd_grid",uVar15,pcVar16);
        return uVar18;
      }
      fprintf(pFVar5,"%d\n",(ulong)((local_e8 - local_e4) + 1));
      if ((int)local_e4 <= local_e8) {
        uVar18 = local_e4;
        do {
          if (pRVar3->max < 1) {
            uVar15 = 1;
          }
          else {
            iVar13 = 0;
            iVar20 = 0;
            do {
              RVar8 = ref_cell_nodes(pRVar3,iVar13,&local_a8);
              iVar20 = iVar20 + (uint)(local_a0 == uVar18 && RVar8 == 0);
              iVar13 = iVar13 + 1;
            } while (iVar13 < pRVar3->max);
            uVar15 = (ulong)(iVar20 + 1);
          }
          fprintf(local_d8,"%d\n",uVar15);
          bVar4 = (int)uVar18 < local_e8;
          uVar18 = uVar18 + 1;
        } while (bVar4);
      }
      iVar13 = local_e8;
      uVar18 = pRVar3->n;
      if ((int)uVar18 < 0) {
        pcVar16 = "malloc c2n of REF_INT negative";
        uVar12 = 0xa7a;
LAB_0016f8f5:
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",
               uVar12,"ref_export_i_like_cfd_grid",pcVar16);
        return 1;
      }
      local_c0 = (REF_INT *)malloc((ulong)uVar18 * 8);
      if (local_c0 == (REF_INT *)0x0) {
        pcVar16 = "malloc c2n of REF_INT NULL";
        uVar12 = 0xa7a;
      }
      else {
        local_b8 = (REF_INT *)malloc((ulong)uVar18 << 2);
        if (local_b8 != (REF_INT *)0x0) {
          uVar9 = local_e4;
          if ((int)local_e4 <= iVar13) {
            do {
              ref_grid_00 = local_e0;
              local_b0 = (ulong)uVar9;
              if (0 < pRVar3->max) {
                iVar13 = 0;
                uVar15 = 0;
                do {
                  RVar8 = ref_cell_nodes(pRVar3,iVar13,&local_a8);
                  if ((RVar8 == 0) && (local_a0 == uVar9)) {
                    uVar18 = ref_grid_orient_edg(ref_grid_00,&local_a8);
                    if (uVar18 != 0) {
                      pcVar16 = "orient based on tri";
                      uVar12 = 0xa80;
                      goto LAB_0016fb9d;
                    }
                    *(ulong *)(local_c0 + (int)uVar15 * 2) = CONCAT44(iStack_a4,local_a8);
                    uVar15 = (ulong)((int)uVar15 + 1);
                  }
                  pRVar7 = local_b8;
                  pRVar6 = local_c0;
                  iVar13 = iVar13 + 1;
                } while (iVar13 < pRVar3->max);
                if (0 < (int)uVar15) {
                  RVar8 = ref_export_order_segments((int)uVar15,local_c0,local_b8);
                  pvVar10 = local_d0;
                  pFVar5 = local_d8;
                  if (RVar8 != 0) {
                    pcVar16 = "order";
                    uVar18 = 1;
                    uVar12 = 0xa87;
                    uVar15 = 1;
                    goto LAB_0016fba0;
                  }
                  fprintf(local_d8,"%d\n",
                          (ulong)(*(int *)((long)local_d0 + (long)pRVar6[(long)*pRVar7 * 2] * 4) + 1
                                 ));
                  uVar17 = 0;
                  do {
                    fprintf(pFVar5,"%d\n",
                            (ulong)(*(int *)((long)pvVar10 +
                                            (long)pRVar6[(long)local_b8[uVar17] * 2 + 1] * 4) + 1));
                    uVar17 = uVar17 + 1;
                  } while (uVar15 != uVar17);
                }
              }
              uVar9 = (int)local_b0 + 1;
            } while ((int)local_b0 < local_e8);
          }
          free(local_b8);
          free(local_c0);
          free(local_c8);
          free(local_d0);
          fclose(local_d8);
          return 0;
        }
        pcVar16 = "malloc order of REF_INT NULL";
        uVar12 = 0xa7b;
      }
LAB_0016fb04:
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",
             uVar12,"ref_export_i_like_cfd_grid",pcVar16);
      return 2;
    }
    pcVar16 = "quad miscount";
    uVar12 = 0xa6a;
    lVar11 = 0;
  }
  else {
    lVar11 = (long)iVar13;
    pcVar16 = "triangle miscount";
    uVar12 = 0xa61;
  }
  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",uVar12,
         "ref_export_i_like_cfd_grid",pcVar16,lVar11,lVar14);
  return 1;
}

Assistant:

REF_FCN static REF_STATUS ref_export_i_like_cfd_grid(REF_GRID ref_grid,
                                                     const char *filename) {
  FILE *f;
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT node;
  REF_INT *o2n, *n2o, *c2n, *order;
  REF_INT nnode;
  REF_CELL ref_cell;
  REF_INT cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT min_id, max_id, id;
  REF_INT ntri, nquad, nedge, edge;

  RAS(ref_grid_twod(ref_grid), "expected twod convention grid");

  f = fopen(filename, "w");
  if (NULL == (void *)f) printf("unable to open %s\n", filename);
  RNS(f, "unable to open file");

  ref_malloc_init(o2n, ref_node_max(ref_node), REF_INT, REF_EMPTY);
  ref_malloc_init(n2o, ref_node_max(ref_node), REF_INT, REF_EMPTY);

  nnode = 0;
  each_ref_node_valid_node(ref_node, node) {
    o2n[node] = nnode;
    n2o[nnode] = node;
    nnode++;
  }

  fprintf(f, "%d %d %d\n", nnode, ref_cell_n(ref_grid_tri(ref_grid)),
          ref_cell_n(ref_grid_qua(ref_grid)));

  for (node = 0; node < nnode; node++) {
    fprintf(f, "%.16E %.16E\n", ref_node_xyz(ref_node, 0, n2o[node]),
            ref_node_xyz(ref_node, 1, n2o[node]));
  }

  ref_cell = ref_grid_tri(ref_grid);
  ntri = 0;
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    ntri++;
    fprintf(f, "%d %d %d\n", o2n[nodes[0]] + 1, o2n[nodes[1]] + 1,
            o2n[nodes[2]] + 1);
  }
  REIS(ntri, ref_cell_n(ref_cell), "triangle miscount");

  ref_cell = ref_grid_qua(ref_grid);
  nquad = 0;
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    ntri++;
    fprintf(f, "%d %d %d %d\n", o2n[nodes[0]] + 1, o2n[nodes[1]] + 1,
            o2n[nodes[2]] + 1, o2n[nodes[3]] + 1);
  }
  REIS(nquad, ref_cell_n(ref_cell), "quad miscount");

  ref_cell = ref_grid_edg(ref_grid);
  RSS(ref_cell_id_range(ref_cell, ref_grid_mpi(ref_grid), &min_id, &max_id),
      "id range");
  fprintf(f, "%d\n", max_id - min_id + 1);
  for (id = min_id; id <= max_id; id++) {
    nedge = 0;
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      if (nodes[2] == id) {
        nedge++;
      }
    }
    fprintf(f, "%d\n", nedge + 1); /* +1, both end points */
  }

  ref_malloc(c2n, 2 * ref_cell_n(ref_cell), REF_INT);
  ref_malloc(order, ref_cell_n(ref_cell), REF_INT);
  for (id = min_id; id <= max_id; id++) {
    nedge = 0;
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      if (nodes[2] == id) {
        RSS(ref_grid_orient_edg(ref_grid, nodes), "orient based on tri");
        c2n[0 + 2 * nedge] = nodes[0];
        c2n[1 + 2 * nedge] = nodes[1];
        nedge++;
      }
    }
    if (nedge > 0) {
      RSS(ref_export_order_segments(nedge, c2n, order), "order");
      fprintf(f, "%d\n", o2n[c2n[0 + 2 * order[0]]] + 1);
      for (edge = 0; edge < nedge; edge++) {
        fprintf(f, "%d\n", o2n[c2n[1 + 2 * order[edge]]] + 1);
      }
    }
  }

  ref_free(order);
  ref_free(c2n);
  ref_free(n2o);
  ref_free(o2n);

  fclose(f);

  return REF_SUCCESS;
}